

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerImpl::GetRawActiveDataset
          (CommissionerImpl *this,Handler<ByteArray> *aHandler,uint16_t aDatasetFlags)

{
  bool bVar1;
  uint uVar2;
  Error *pEVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar4;
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  Error local_440;
  ErrorCode local_418;
  anon_class_1_0_00000001 local_412;
  v10 local_411;
  v10 *local_410;
  size_t local_408;
  string local_400;
  allocator local_3d9;
  string local_3d8;
  ResponseHandler local_3b8;
  ErrorCode local_394;
  Error local_390;
  ErrorCode local_364;
  Tlv local_360;
  Error local_340;
  ErrorCode local_318;
  allocator local_311;
  string local_310;
  Error local_2f0;
  anon_class_1_0_00000001 local_2c2;
  v10 local_2c1;
  v10 *local_2c0;
  size_t local_2b8;
  string local_2b0;
  Error local_290;
  undefined1 local_268 [8];
  anon_class_32_1_d0c21527 onResponse;
  ByteArray datasetList;
  undefined1 local_220 [8];
  Request request;
  Error error;
  uint16_t aDatasetFlags_local;
  Handler<ByteArray> *aHandler_local;
  CommissionerImpl *this_local;
  undefined1 local_140 [16];
  v10 *local_130;
  ulong local_128;
  v10 *local_120;
  size_t sStack_118;
  string *local_110;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_108 [2];
  undefined1 local_f8 [16];
  v10 *local_e8;
  ulong local_e0;
  v10 *local_d8;
  size_t sStack_d0;
  string *local_c8;
  v10 *local_c0;
  v10 **local_b8;
  v10 *local_b0;
  v10 **local_a8;
  v10 **local_a0;
  v10 *local_98;
  size_t sStack_90;
  v10 **local_80;
  v10 *local_78;
  size_t sStack_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_68;
  undefined1 *local_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_58;
  undefined8 local_50;
  undefined1 *local_48;
  CommissionerImpl **local_40;
  undefined1 *local_38;
  CommissionerImpl **local_30;
  undefined8 local_28;
  undefined1 *local_20;
  CommissionerImpl **local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_10;
  
  Error::Error((Error *)&request.mEndpoint);
  coap::Message::Message((Message *)local_220,kConfirmable,kPost);
  GetActiveOperationalDatasetTlvs((ByteArray *)&onResponse.aHandler._M_invoker,aDatasetFlags);
  std::
  function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
  ::function((function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
              *)local_268,aHandler);
  bVar1 = IsActiveOrConnected(this);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_310,"/c/ag",&local_311);
    coap::Message::SetUriPath(&local_2f0,(Message *)local_220,&local_310);
    pEVar3 = Error::operator=((Error *)&request.mEndpoint,&local_2f0);
    local_318 = kNone;
    bVar1 = commissioner::operator!=(pEVar3,&local_318);
    Error::~Error(&local_2f0);
    std::__cxx11::string::~string((string *)&local_310);
    std::allocator<char>::~allocator((allocator<char> *)&local_311);
    if (!bVar1) {
      bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &onResponse.aHandler._M_invoker);
      if (!bVar1) {
        tlv::Tlv::Tlv(&local_360,kGet,(ByteArray *)&onResponse.aHandler._M_invoker,kMeshCoP);
        AppendTlv(&local_340,(Message *)local_220,&local_360);
        pEVar3 = Error::operator=((Error *)&request.mEndpoint,&local_340);
        local_364 = kNone;
        bVar1 = commissioner::operator!=(pEVar3,&local_364);
        Error::~Error(&local_340);
        tlv::Tlv::~Tlv(&local_360);
        if (bVar1) goto LAB_001afc8e;
      }
      uVar2 = (*(this->super_Commissioner)._vptr_Commissioner[10])();
      if ((uVar2 & 1) != 0) {
        SignRequest(&local_390,this,(Request *)local_220,kMeshCoP,true);
        pEVar3 = Error::operator=((Error *)&request.mEndpoint,&local_390);
        local_394 = kNone;
        bVar1 = commissioner::operator!=(pEVar3,&local_394);
        Error::~Error(&local_390);
        if (bVar1) goto LAB_001afc8e;
      }
      std::function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>::
      function<ot::commissioner::CommissionerImpl::GetRawActiveDataset(std::function<void(std::vector<unsigned_char,std::allocator<unsigned_char>>const*,ot::commissioner::Error)>,unsigned_short)::__0&,void>
                ((function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)> *)
                 &local_3b8,(anon_class_32_1_d0c21527 *)local_268);
      coap::CoapSecure::SendRequest(&this->mBrClient,(Request *)local_220,&local_3b8);
      std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::
      ~function(&local_3b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3d8,"mgmt",&local_3d9);
      GetRawActiveDataset::anon_class_1_0_00000001::operator()(&local_412);
      local_a8 = &local_410;
      local_b0 = &local_411;
      bVar4 = ::fmt::v10::operator()(local_b0);
      local_408 = bVar4.size_;
      local_410 = (v10 *)bVar4.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_110 = &local_400;
      local_120 = local_410;
      sStack_118 = local_408;
      local_80 = &local_120;
      local_130 = local_410;
      local_128 = local_408;
      local_78 = local_130;
      sStack_70 = local_128;
      this_local = (CommissionerImpl *)
                   ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_38 = local_140;
      local_40 = &this_local;
      local_28 = 0;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_40;
      fmt_00.size_ = 0;
      fmt_00.data_ = (char *)local_128;
      local_30 = local_40;
      local_20 = local_38;
      local_18 = local_40;
      ::fmt::v10::vformat_abi_cxx11_(&local_400,local_130,fmt_00,args_00);
      Log(kDebug,&local_3d8,&local_400);
      std::__cxx11::string::~string((string *)&local_400);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
    }
  }
  else {
    GetRawActiveDataset::anon_class_1_0_00000001::operator()(&local_2c2);
    local_b8 = &local_2c0;
    local_c0 = &local_2c1;
    bVar4 = ::fmt::v10::operator()(local_c0);
    local_2b8 = bVar4.size_;
    local_2c0 = (v10 *)bVar4.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_c8 = &local_2b0;
    local_d8 = local_2c0;
    sStack_d0 = local_2b8;
    local_a0 = &local_d8;
    local_e8 = local_2c0;
    local_e0 = local_2b8;
    local_98 = local_e8;
    sStack_90 = local_e0;
    local_108[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_60 = local_f8;
    local_68 = local_108;
    local_50 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_68;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_e0;
    local_58 = local_68;
    local_48 = local_60;
    local_10 = local_68;
    ::fmt::v10::vformat_abi_cxx11_(&local_2b0,local_e8,fmt,args);
    Error::Error(&local_290,kInvalidState,&local_2b0);
    Error::operator=((Error *)&request.mEndpoint,&local_290);
    Error::~Error(&local_290);
    std::__cxx11::string::~string((string *)&local_2b0);
  }
LAB_001afc8e:
  local_418 = kNone;
  bVar1 = commissioner::operator!=((Error *)&request.mEndpoint,&local_418);
  if (bVar1) {
    Error::Error(&local_440,(Error *)&request.mEndpoint);
    std::
    function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
    ::operator()(aHandler,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0,&local_440);
    Error::~Error(&local_440);
  }
  GetRawActiveDataset(std::function<void(std::vector<unsigned_char,std::allocator<unsigned_char>>const*,ot::commissioner::Error)>,unsigned_short)
  ::$_0::~__0((__0 *)local_268);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &onResponse.aHandler._M_invoker);
  coap::Message::~Message((Message *)local_220);
  Error::~Error((Error *)&request.mEndpoint);
  return;
}

Assistant:

void CommissionerImpl::GetRawActiveDataset(Handler<ByteArray> aHandler, uint16_t aDatasetFlags)
{
    Error         error;
    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};
    ByteArray     datasetList = GetActiveOperationalDatasetTlvs(aDatasetFlags);

    auto onResponse = [aHandler](const coap::Response *aResponse, Error aError) {
        Error error;

        SuccessOrExit(error = aError);
        SuccessOrExit(error = CheckCoapResponseCode(*aResponse));

        aHandler(&aResponse->GetPayload(), error);

    exit:
        if (error != ErrorCode::kNone)
        {
            aHandler(nullptr, error);
        }
    };

    VerifyOrExit(IsActiveOrConnected(),
                 error = ERROR_INVALID_STATE("the commissioner is not active or secure session is not connected"));
    SuccessOrExit(error = request.SetUriPath(uri::kMgmtActiveGet));
    if (!datasetList.empty())
    {
        SuccessOrExit(error = AppendTlv(request, {tlv::Type::kGet, datasetList}));
    }

#if OT_COMM_CONFIG_CCM_ENABLE
    if (IsCcmMode())
    {
        SuccessOrExit(error = SignRequest(request));
    }
#endif

    // Send MGMT_ACTIVE_GET.req to the Border Agent but not the Leader,
    // because we don't possess the Mesh-Local Prefix before getting the
    // Active Operational Dataset.
    mBrClient.SendRequest(request, onResponse);

    LOG_DEBUG(LOG_REGION_MGMT, "sent MGMT_ACTIVE_GET.req");

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(nullptr, error);
    }
}